

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O2

int __thiscall deqp::egl::MakeCurrentPerfTests::init(MakeCurrentPerfTests *this,EVP_PKEY_CTX *ctx)

{
  SurfaceType SVar1;
  EglTestContext *pEVar2;
  _Alloc_hider _Var3;
  int extraout_EAX;
  TestCaseGroup *pTVar4;
  MakeCurrentPerfCase *pMVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  Spec spec;
  string local_78;
  string local_58;
  long local_38;
  
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_eglTestCtx,"simple",
             "Simple eglMakeCurrent performance tests using single context and surface");
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    SVar1 = (&DAT_017e18f0)[lVar6];
    iVar9 = 2;
    while( true ) {
      bVar12 = iVar9 == 0;
      iVar9 = iVar9 + -1;
      if (bVar12) break;
      spec._4_8_ = &DAT_100000001;
      spec.iterationCount = 100;
      spec.sampleCount = 100;
      spec.surfaceTypes = SVar1;
      spec.release = iVar9 == 0;
      pMVar5 = (MakeCurrentPerfCase *)operator_new(0x128);
      pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
      MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_58,&spec);
      _Var3._M_p = local_58._M_dataplus._M_p;
      MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_78,&spec);
      MakeCurrentPerfCase::MakeCurrentPerfCase
                (pMVar5,pEVar2,&spec,_Var3._M_p,local_78._M_dataplus._M_p);
      tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pMVar5);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_eglTestCtx,"multi_context",
             "eglMakeCurrent performance tests using multiple contexts and single surface");
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    iVar9 = (&DAT_017e1960)[lVar6];
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      SVar1 = (&DAT_017e18f0)[lVar7];
      iVar11 = 2;
      while( true ) {
        bVar12 = iVar11 == 0;
        iVar11 = iVar11 + -1;
        if (bVar12) break;
        spec.surfaceCount = 1;
        spec.contextCount = iVar9;
        spec.iterationCount = 100;
        spec.sampleCount = 100;
        spec.surfaceTypes = SVar1;
        spec.release = iVar11 == 0;
        pMVar5 = (MakeCurrentPerfCase *)operator_new(0x128);
        pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
        MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_58,&spec);
        _Var3._M_p = local_58._M_dataplus._M_p;
        MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_78,&spec);
        MakeCurrentPerfCase::MakeCurrentPerfCase
                  (pMVar5,pEVar2,&spec,_Var3._M_p,local_78._M_dataplus._M_p);
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pMVar5);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_58);
      }
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_eglTestCtx,"multi_surface",
             "eglMakeCurrent performance tests using single context and multiple surfaces");
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    iVar9 = (&DAT_017e1960)[lVar6];
    for (lVar7 = 0; lVar7 != 7; lVar7 = lVar7 + 1) {
      SVar1 = (&DAT_017e1900)[lVar7];
      iVar11 = 2;
      while( true ) {
        bVar12 = iVar11 == 0;
        iVar11 = iVar11 + -1;
        if (bVar12) break;
        spec.surfaceCount = iVar9;
        spec.contextCount = 1;
        spec.iterationCount = 100;
        spec.sampleCount = 100;
        spec.surfaceTypes = SVar1;
        spec.release = iVar11 == 0;
        pMVar5 = (MakeCurrentPerfCase *)operator_new(0x128);
        pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
        MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_58,&spec);
        _Var3._M_p = local_58._M_dataplus._M_p;
        MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_78,&spec);
        MakeCurrentPerfCase::MakeCurrentPerfCase
                  (pMVar5,pEVar2,&spec,_Var3._M_p,local_78._M_dataplus._M_p);
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pMVar5);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_58);
      }
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_eglTestCtx,"complex",
             "eglMakeCurrent performance tests using multiple contexts and multiple surfaces");
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    iVar9 = (&DAT_017e1960)[lVar6];
    lVar7 = 0;
    while (lVar7 != 2) {
      iVar11 = (&DAT_017e1960)[lVar7];
      local_38 = lVar7;
      for (lVar8 = 0; lVar8 != 7; lVar8 = lVar8 + 1) {
        SVar1 = (&DAT_017e1900)[lVar8];
        iVar10 = 2;
        while( true ) {
          bVar12 = iVar10 == 0;
          iVar10 = iVar10 + -1;
          if (bVar12) break;
          spec.surfaceCount = iVar9;
          spec.contextCount = iVar11;
          spec.iterationCount = 100;
          spec.sampleCount = 100;
          spec.surfaceTypes = SVar1;
          spec.release = iVar10 == 0;
          pMVar5 = (MakeCurrentPerfCase *)operator_new(0x128);
          pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
          MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_58,&spec);
          _Var3._M_p = local_58._M_dataplus._M_p;
          MakeCurrentPerfCase::Spec::toName_abi_cxx11_(&local_78,&spec);
          MakeCurrentPerfCase::MakeCurrentPerfCase
                    (pMVar5,pEVar2,&spec,_Var3._M_p,local_78._M_dataplus._M_p);
          tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pMVar5);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_58);
        }
      }
      lVar7 = local_38 + 1;
    }
  }
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  return extraout_EAX;
}

Assistant:

void MakeCurrentPerfTests::init (void)
{
	const int iterationCount	= 100;
	const int sampleCount		= 100;

	// Add simple test group
	{
		TestCaseGroup* simple = new TestCaseGroup(m_eglTestCtx, "simple", "Simple eglMakeCurrent performance tests using single context and surface");

		const MakeCurrentPerfCase::SurfaceType types[] = {
			MakeCurrentPerfCase::SURFACETYPE_PBUFFER,
			MakeCurrentPerfCase::SURFACETYPE_PIXMAP,
			MakeCurrentPerfCase::SURFACETYPE_WINDOW
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			for (int releaseNdx = 0; releaseNdx < 2; releaseNdx++)
			{
				MakeCurrentPerfCase::Spec spec;

				spec.surfaceTypes	= types[typeNdx];
				spec.contextCount	= 1;
				spec.surfaceCount	= 1;
				spec.release		= (releaseNdx == 1);
				spec.iterationCount	= iterationCount;
				spec.sampleCount	= sampleCount;

				simple->addChild(new MakeCurrentPerfCase(m_eglTestCtx, spec, spec.toName().c_str(), spec.toDescription().c_str()));
			}
		}

		addChild(simple);
	}

	// Add multi context test group
	{
		TestCaseGroup* multiContext = new TestCaseGroup(m_eglTestCtx, "multi_context", "eglMakeCurrent performance tests using multiple contexts and single surface");

		const MakeCurrentPerfCase::SurfaceType types[] = {
			MakeCurrentPerfCase::SURFACETYPE_PBUFFER,
			MakeCurrentPerfCase::SURFACETYPE_PIXMAP,
			MakeCurrentPerfCase::SURFACETYPE_WINDOW
		};

		const int contextCounts[] = {
			10, 100
		};

		for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(contextCounts); contextCountNdx++)
		{
			for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
			{
				for (int releaseNdx = 0; releaseNdx < 2; releaseNdx++)
				{
					MakeCurrentPerfCase::Spec spec;

					spec.surfaceTypes	= types[typeNdx];
					spec.contextCount	= contextCounts[contextCountNdx];
					spec.surfaceCount	= 1;
					spec.release		= (releaseNdx == 1);
					spec.iterationCount	= iterationCount;
					spec.sampleCount	= sampleCount;

					multiContext->addChild(new MakeCurrentPerfCase(m_eglTestCtx, spec, spec.toName().c_str(), spec.toDescription().c_str()));
				}
			}
		}

		addChild(multiContext);
	}

	// Add multi surface test group
	{
		TestCaseGroup* multiSurface = new TestCaseGroup(m_eglTestCtx, "multi_surface", "eglMakeCurrent performance tests using single context and multiple surfaces");

		const MakeCurrentPerfCase::SurfaceType types[] = {
			MakeCurrentPerfCase::SURFACETYPE_PBUFFER,
			MakeCurrentPerfCase::SURFACETYPE_PIXMAP,
			MakeCurrentPerfCase::SURFACETYPE_WINDOW,

			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER	|MakeCurrentPerfCase::SURFACETYPE_PIXMAP),
			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER	|MakeCurrentPerfCase::SURFACETYPE_WINDOW),
			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PIXMAP	|MakeCurrentPerfCase::SURFACETYPE_WINDOW),

			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER|MakeCurrentPerfCase::SURFACETYPE_PIXMAP|MakeCurrentPerfCase::SURFACETYPE_WINDOW)
		};

		const int surfaceCounts[] = {
			10, 100
		};

		for (int surfaceCountNdx = 0; surfaceCountNdx < DE_LENGTH_OF_ARRAY(surfaceCounts); surfaceCountNdx++)
		{
			for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
			{
				for (int releaseNdx = 0; releaseNdx < 2; releaseNdx++)
				{
					MakeCurrentPerfCase::Spec spec;

					spec.surfaceTypes	= types[typeNdx];
					spec.surfaceCount	= surfaceCounts[surfaceCountNdx];
					spec.contextCount	= 1;
					spec.release		= (releaseNdx == 1);
					spec.iterationCount	= iterationCount;
					spec.sampleCount	= sampleCount;

					multiSurface->addChild(new MakeCurrentPerfCase(m_eglTestCtx, spec, spec.toName().c_str(), spec.toDescription().c_str()));
				}
			}
		}

		addChild(multiSurface);
	}

	// Add Complex? test group
	{
		TestCaseGroup* multi = new TestCaseGroup(m_eglTestCtx, "complex", "eglMakeCurrent performance tests using multiple contexts and multiple surfaces");

		const MakeCurrentPerfCase::SurfaceType types[] = {
			MakeCurrentPerfCase::SURFACETYPE_PBUFFER,
			MakeCurrentPerfCase::SURFACETYPE_PIXMAP,
			MakeCurrentPerfCase::SURFACETYPE_WINDOW,

			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER	|MakeCurrentPerfCase::SURFACETYPE_PIXMAP),
			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER	|MakeCurrentPerfCase::SURFACETYPE_WINDOW),
			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PIXMAP	|MakeCurrentPerfCase::SURFACETYPE_WINDOW),

			(MakeCurrentPerfCase::SurfaceType)(MakeCurrentPerfCase::SURFACETYPE_PBUFFER|MakeCurrentPerfCase::SURFACETYPE_PIXMAP|MakeCurrentPerfCase::SURFACETYPE_WINDOW)
		};

		const int surfaceCounts[] = {
			10, 100
		};


		const int contextCounts[] = {
			10, 100
		};

		for (int surfaceCountNdx = 0; surfaceCountNdx < DE_LENGTH_OF_ARRAY(surfaceCounts); surfaceCountNdx++)
		{
			for (int contextCountNdx = 0; contextCountNdx < DE_LENGTH_OF_ARRAY(contextCounts); contextCountNdx++)
			{
				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
				{
					for (int releaseNdx = 0; releaseNdx < 2; releaseNdx++)
					{
						MakeCurrentPerfCase::Spec spec;

						spec.surfaceTypes	= types[typeNdx];
						spec.contextCount	= contextCounts[contextCountNdx];
						spec.surfaceCount	= surfaceCounts[surfaceCountNdx];
						spec.release		= (releaseNdx == 1);
						spec.iterationCount	= iterationCount;
						spec.sampleCount	= sampleCount;

						multi->addChild(new MakeCurrentPerfCase(m_eglTestCtx, spec, spec.toName().c_str(), spec.toDescription().c_str()));
					}
				}
			}
		}

		addChild(multi);
	}
}